

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
duckdb::DBConfig::GetOptionNames_abi_cxx11_(void)

{
  ConfigurationOption *in_RAX;
  idx_t iVar1;
  ConfigurationOption *__args;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RDI;
  idx_t target_index;
  optional_ptr<const_duckdb::ConfigurationOption,_true> local_28;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  local_28.ptr = in_RAX;
  iVar1 = GetOptionCount();
  for (target_index = 0; iVar1 != target_index; target_index = target_index + 1) {
    local_28 = GetOptionByIndex(target_index);
    __args = optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->(&local_28);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*const&>(in_RDI,&__args->name);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)in_RDI;
}

Assistant:

vector<std::string> DBConfig::GetOptionNames() {
	vector<string> names;
	for (idx_t i = 0, option_count = DBConfig::GetOptionCount(); i < option_count; i++) {
		names.emplace_back(DBConfig::GetOptionByIndex(i)->name);
	}
	return names;
}